

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftobjs.c
# Opt level: O0

FT_Error open_face_from_buffer
                   (FT_Library library,FT_Byte *base,FT_ULong size,FT_Long face_index,
                   char *driver_name,FT_Face *aface)

{
  FT_Memory memory_00;
  FT_Memory memory;
  FT_Stream stream;
  undefined1 local_80 [4];
  FT_Error error;
  FT_Open_Args args;
  FT_Face *aface_local;
  char *driver_name_local;
  FT_Long face_index_local;
  FT_ULong size_local;
  FT_Byte *base_local;
  FT_Library library_local;
  
  memory = (FT_Memory)0x0;
  memory_00 = library->memory;
  args.params = (FT_Parameter *)aface;
  stream._4_4_ = new_memory_stream(library,base,size,memory_stream_close,(FT_Stream *)&memory);
  if (stream._4_4_ == 0) {
    local_80 = (undefined1  [4])0x2;
    args.pathname = (FT_String *)memory;
    if (driver_name != (char *)0x0) {
      local_80 = (undefined1  [4])0xa;
      args.stream = (FT_Stream)FT_Get_Module(library,driver_name);
    }
    stream._4_4_ = ft_open_face_internal
                             (library,(FT_Open_Args *)local_80,face_index,(FT_Face *)args.params,
                              '\0');
    if (stream._4_4_ == 0) {
      *(ulong *)((args.params)->tag + 0x10) =
           *(ulong *)((args.params)->tag + 0x10) & 0xfffffffffffffbff;
    }
    else {
      FT_Stream_Close((FT_Stream)memory);
      ft_mem_free(memory_00,memory);
    }
    library_local._4_4_ = stream._4_4_;
  }
  else {
    ft_mem_free(memory_00,base);
    library_local._4_4_ = stream._4_4_;
  }
  return library_local._4_4_;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  open_face_from_buffer( FT_Library   library,
                         FT_Byte*     base,
                         FT_ULong     size,
                         FT_Long      face_index,
                         const char*  driver_name,
                         FT_Face     *aface )
  {
    FT_Open_Args  args;
    FT_Error      error;
    FT_Stream     stream = NULL;
    FT_Memory     memory = library->memory;


    error = new_memory_stream( library,
                               base,
                               size,
                               memory_stream_close,
                               &stream );
    if ( error )
    {
      FT_FREE( base );
      return error;
    }

    args.flags  = FT_OPEN_STREAM;
    args.stream = stream;
    if ( driver_name )
    {
      args.flags  = args.flags | FT_OPEN_DRIVER;
      args.driver = FT_Get_Module( library, driver_name );
    }

#ifdef FT_MACINTOSH
    /* At this point, the face index has served its purpose;  */
    /* whoever calls this function has already used it to     */
    /* locate the correct font data.  We should not propagate */
    /* this index to FT_Open_Face() (unless it is negative).  */

    if ( face_index > 0 )
      face_index &= 0x7FFF0000L; /* retain GX data */
#endif

    error = ft_open_face_internal( library, &args, face_index, aface, 0 );

    if ( !error )
      (*aface)->face_flags &= ~FT_FACE_FLAG_EXTERNAL_STREAM;
    else
#ifdef FT_MACINTOSH
      FT_Stream_Free( stream, 0 );
#else
    {
      FT_Stream_Close( stream );
      FT_FREE( stream );
    }
#endif

    return error;
  }